

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

int translateKeyCodeA(int keySym)

{
  int keySym_local;
  
  if (keySym == 0x20) {
    return 0x20;
  }
  if (keySym == 0x27) {
    return 0x27;
  }
  if (keySym == 0x2c) {
    return 0x2c;
  }
  if (keySym == 0x2d) {
    return 0x2d;
  }
  if (keySym == 0x2e) {
    return 0x2e;
  }
  if (keySym == 0x2f) {
    return 0x2f;
  }
  if (keySym == 0x30) {
    return 0x30;
  }
  if (keySym == 0x31) {
    return 0x31;
  }
  if (keySym == 0x32) {
    return 0x32;
  }
  if (keySym == 0x33) {
    return 0x33;
  }
  if (keySym == 0x34) {
    return 0x34;
  }
  if (keySym == 0x35) {
    return 0x35;
  }
  if (keySym == 0x36) {
    return 0x36;
  }
  if (keySym == 0x37) {
    return 0x37;
  }
  if (keySym == 0x38) {
    return 0x38;
  }
  if (keySym == 0x39) {
    return 0x39;
  }
  if (keySym == 0x3b) {
    return 0x3b;
  }
  if (keySym == 0x3c) {
    return 0xa1;
  }
  if (keySym == 0x3d) {
    return 0x3d;
  }
  if (keySym == 0x5b) {
    return 0x5b;
  }
  if (keySym == 0x5c) {
    return 0x5c;
  }
  if (keySym == 0x5d) {
    return 0x5d;
  }
  if (keySym == 0x60) {
    return 0x60;
  }
  if (keySym == 0x61) {
    return 0x41;
  }
  if (keySym == 0x62) {
    return 0x42;
  }
  if (keySym == 99) {
    return 0x43;
  }
  if (keySym == 100) {
    return 0x44;
  }
  if (keySym == 0x65) {
    return 0x45;
  }
  if (keySym == 0x66) {
    return 0x46;
  }
  if (keySym == 0x67) {
    return 0x47;
  }
  if (keySym == 0x68) {
    return 0x48;
  }
  if (keySym == 0x69) {
    return 0x49;
  }
  if (keySym == 0x6a) {
    return 0x4a;
  }
  if (keySym == 0x6b) {
    return 0x4b;
  }
  if (keySym == 0x6c) {
    return 0x4c;
  }
  if (keySym == 0x6d) {
    return 0x4d;
  }
  if (keySym == 0x6e) {
    return 0x4e;
  }
  if (keySym == 0x6f) {
    return 0x4f;
  }
  if (keySym == 0x70) {
    return 0x50;
  }
  if (keySym == 0x71) {
    return 0x51;
  }
  if (keySym == 0x72) {
    return 0x52;
  }
  if (keySym == 0x73) {
    return 0x53;
  }
  if (keySym == 0x74) {
    return 0x54;
  }
  if (keySym == 0x75) {
    return 0x55;
  }
  if (keySym == 0x76) {
    return 0x56;
  }
  if (keySym == 0x77) {
    return 0x57;
  }
  if (keySym == 0x78) {
    return 0x58;
  }
  if (keySym == 0x79) {
    return 0x59;
  }
  if (keySym == 0x7a) {
    return 0x5a;
  }
  if (keySym != 0xfe03) {
    if (keySym == 0xff08) {
      return 0x103;
    }
    if (keySym == 0xff09) {
      return 0x102;
    }
    if (keySym == 0xff0d) {
      return 0x101;
    }
    if (keySym == 0xff13) {
      return 0x11c;
    }
    if (keySym == 0xff14) {
      return 0x119;
    }
    if (keySym == 0xff1b) {
      return 0x100;
    }
    if (keySym == 0xff50) {
      return 0x10c;
    }
    if (keySym == 0xff51) {
      return 0x107;
    }
    if (keySym == 0xff52) {
      return 0x109;
    }
    if (keySym == 0xff53) {
      return 0x106;
    }
    if (keySym == 0xff54) {
      return 0x108;
    }
    if (keySym == 0xff55) {
      return 0x10a;
    }
    if (keySym == 0xff56) {
      return 0x10b;
    }
    if (keySym == 0xff57) {
      return 0x10d;
    }
    if (keySym == 0xff61) {
      return 0x11b;
    }
    if (keySym == 0xff63) {
      return 0x104;
    }
    if (keySym == 0xff67) {
      return 0x15c;
    }
    if (keySym != 0xff7e) {
      if (keySym == 0xff7f) {
        return 0x11a;
      }
      if (keySym == 0xff8d) {
        return 0x14f;
      }
      if (keySym == 0xff95) {
        return 0x147;
      }
      if (keySym == 0xff96) {
        return 0x144;
      }
      if (keySym == 0xff97) {
        return 0x148;
      }
      if (keySym == 0xff98) {
        return 0x146;
      }
      if (keySym == 0xff99) {
        return 0x142;
      }
      if (keySym == 0xff9a) {
        return 0x149;
      }
      if (keySym == 0xff9b) {
        return 0x143;
      }
      if (keySym == 0xff9c) {
        return 0x141;
      }
      if (keySym == 0xff9e) {
        return 0x140;
      }
      if (keySym == 0xff9f) {
        return 0x14a;
      }
      if (keySym == 0xffaa) {
        return 0x14c;
      }
      if (keySym == 0xffab) {
        return 0x14e;
      }
      if (keySym == 0xffad) {
        return 0x14d;
      }
      if (keySym == 0xffaf) {
        return 0x14b;
      }
      if (keySym == 0xffbd) {
        return 0x150;
      }
      if (keySym == 0xffbe) {
        return 0x122;
      }
      if (keySym == 0xffbf) {
        return 0x123;
      }
      if (keySym == 0xffc0) {
        return 0x124;
      }
      if (keySym == 0xffc1) {
        return 0x125;
      }
      if (keySym == 0xffc2) {
        return 0x126;
      }
      if (keySym == 0xffc3) {
        return 0x127;
      }
      if (keySym == 0xffc4) {
        return 0x128;
      }
      if (keySym == 0xffc5) {
        return 0x129;
      }
      if (keySym == 0xffc6) {
        return 0x12a;
      }
      if (keySym == 0xffc7) {
        return 299;
      }
      if (keySym == 0xffc8) {
        return 300;
      }
      if (keySym == 0xffc9) {
        return 0x12d;
      }
      if (keySym == 0xffca) {
        return 0x12e;
      }
      if (keySym == 0xffcb) {
        return 0x12f;
      }
      if (keySym == 0xffcc) {
        return 0x130;
      }
      if (keySym == 0xffcd) {
        return 0x131;
      }
      if (keySym == 0xffce) {
        return 0x132;
      }
      if (keySym == 0xffcf) {
        return 0x133;
      }
      if (keySym == 0xffd0) {
        return 0x134;
      }
      if (keySym == 0xffd1) {
        return 0x135;
      }
      if (keySym == 0xffd2) {
        return 0x136;
      }
      if (keySym == 0xffd3) {
        return 0x137;
      }
      if (keySym == 0xffd4) {
        return 0x138;
      }
      if (keySym == 0xffd5) {
        return 0x139;
      }
      if (keySym == 0xffd6) {
        return 0x13a;
      }
      if (keySym == 0xffe1) {
        return 0x154;
      }
      if (keySym == 0xffe2) {
        return 0x158;
      }
      if (keySym == 0xffe3) {
        return 0x155;
      }
      if (keySym == 0xffe4) {
        return 0x159;
      }
      if (keySym == 0xffe5) {
        return 0x118;
      }
      if (keySym == 0xffe7) {
        return 0x156;
      }
      if (keySym != 0xffe8) {
        if (keySym == 0xffe9) {
          return 0x156;
        }
        if (keySym != 0xffea) {
          if (keySym == 0xffeb) {
            return 0x157;
          }
          if (keySym != 0xffec) {
            if (keySym != 0xffff) {
              return -1;
            }
            return 0x105;
          }
          return 0x15b;
        }
      }
    }
  }
  return 0x15a;
}

Assistant:

static int translateKeyCodeA(int keySym) {
    switch (keySym)
    {
        case XK_Escape:         return KB_KEY_ESCAPE;
        case XK_Tab:            return KB_KEY_TAB;
        case XK_Shift_L:        return KB_KEY_LEFT_SHIFT;
        case XK_Shift_R:        return KB_KEY_RIGHT_SHIFT;
        case XK_Control_L:      return KB_KEY_LEFT_CONTROL;
        case XK_Control_R:      return KB_KEY_RIGHT_CONTROL;
        case XK_Meta_L:
        case XK_Alt_L:          return KB_KEY_LEFT_ALT;
        case XK_Mode_switch:      // Mapped to Alt_R on many keyboards
        case XK_ISO_Level3_Shift: // AltGr on at least some machines
        case XK_Meta_R:
        case XK_Alt_R:          return KB_KEY_RIGHT_ALT;
        case XK_Super_L:        return KB_KEY_LEFT_SUPER;
        case XK_Super_R:        return KB_KEY_RIGHT_SUPER;
        case XK_Menu:           return KB_KEY_MENU;
        case XK_Num_Lock:       return KB_KEY_NUM_LOCK;
        case XK_Caps_Lock:      return KB_KEY_CAPS_LOCK;
        case XK_Print:          return KB_KEY_PRINT_SCREEN;
        case XK_Scroll_Lock:    return KB_KEY_SCROLL_LOCK;
        case XK_Pause:          return KB_KEY_PAUSE;
        case XK_Delete:         return KB_KEY_DELETE;
        case XK_BackSpace:      return KB_KEY_BACKSPACE;
        case XK_Return:         return KB_KEY_ENTER;
        case XK_Home:           return KB_KEY_HOME;
        case XK_End:            return KB_KEY_END;
        case XK_Page_Up:        return KB_KEY_PAGE_UP;
        case XK_Page_Down:      return KB_KEY_PAGE_DOWN;
        case XK_Insert:         return KB_KEY_INSERT;
        case XK_Left:           return KB_KEY_LEFT;
        case XK_Right:          return KB_KEY_RIGHT;
        case XK_Down:           return KB_KEY_DOWN;
        case XK_Up:             return KB_KEY_UP;
        case XK_F1:             return KB_KEY_F1;
        case XK_F2:             return KB_KEY_F2;
        case XK_F3:             return KB_KEY_F3;
        case XK_F4:             return KB_KEY_F4;
        case XK_F5:             return KB_KEY_F5;
        case XK_F6:             return KB_KEY_F6;
        case XK_F7:             return KB_KEY_F7;
        case XK_F8:             return KB_KEY_F8;
        case XK_F9:             return KB_KEY_F9;
        case XK_F10:            return KB_KEY_F10;
        case XK_F11:            return KB_KEY_F11;
        case XK_F12:            return KB_KEY_F12;
        case XK_F13:            return KB_KEY_F13;
        case XK_F14:            return KB_KEY_F14;
        case XK_F15:            return KB_KEY_F15;
        case XK_F16:            return KB_KEY_F16;
        case XK_F17:            return KB_KEY_F17;
        case XK_F18:            return KB_KEY_F18;
        case XK_F19:            return KB_KEY_F19;
        case XK_F20:            return KB_KEY_F20;
        case XK_F21:            return KB_KEY_F21;
        case XK_F22:            return KB_KEY_F22;
        case XK_F23:            return KB_KEY_F23;
        case XK_F24:            return KB_KEY_F24;
        case XK_F25:            return KB_KEY_F25;

        // Numeric keypad
        case XK_KP_Divide:      return KB_KEY_KP_DIVIDE;
        case XK_KP_Multiply:    return KB_KEY_KP_MULTIPLY;
        case XK_KP_Subtract:    return KB_KEY_KP_SUBTRACT;
        case XK_KP_Add:         return KB_KEY_KP_ADD;

        // These should have been detected in secondary keysym test above!
        case XK_KP_Insert:      return KB_KEY_KP_0;
        case XK_KP_End:         return KB_KEY_KP_1;
        case XK_KP_Down:        return KB_KEY_KP_2;
        case XK_KP_Page_Down:   return KB_KEY_KP_3;
        case XK_KP_Left:        return KB_KEY_KP_4;
        case XK_KP_Right:       return KB_KEY_KP_6;
        case XK_KP_Home:        return KB_KEY_KP_7;
        case XK_KP_Up:          return KB_KEY_KP_8;
        case XK_KP_Page_Up:     return KB_KEY_KP_9;
        case XK_KP_Delete:      return KB_KEY_KP_DECIMAL;
        case XK_KP_Equal:       return KB_KEY_KP_EQUAL;
        case XK_KP_Enter:       return KB_KEY_KP_ENTER;

        // Last resort: Check for printable keys (should not happen if the XKB
        // extension is available). This will give a layout dependent mapping
        // (which is wrong, and we may miss some keys, especially on non-US
        // keyboards), but it's better than nothing...
        case XK_a:              return KB_KEY_A;
        case XK_b:              return KB_KEY_B;
        case XK_c:              return KB_KEY_C;
        case XK_d:              return KB_KEY_D;
        case XK_e:              return KB_KEY_E;
        case XK_f:              return KB_KEY_F;
        case XK_g:              return KB_KEY_G;
        case XK_h:              return KB_KEY_H;
        case XK_i:              return KB_KEY_I;
        case XK_j:              return KB_KEY_J;
        case XK_k:              return KB_KEY_K;
        case XK_l:              return KB_KEY_L;
        case XK_m:              return KB_KEY_M;
        case XK_n:              return KB_KEY_N;
        case XK_o:              return KB_KEY_O;
        case XK_p:              return KB_KEY_P;
        case XK_q:              return KB_KEY_Q;
        case XK_r:              return KB_KEY_R;
        case XK_s:              return KB_KEY_S;
        case XK_t:              return KB_KEY_T;
        case XK_u:              return KB_KEY_U;
        case XK_v:              return KB_KEY_V;
        case XK_w:              return KB_KEY_W;
        case XK_x:              return KB_KEY_X;
        case XK_y:              return KB_KEY_Y;
        case XK_z:              return KB_KEY_Z;
        case XK_1:              return KB_KEY_1;
        case XK_2:              return KB_KEY_2;
        case XK_3:              return KB_KEY_3;
        case XK_4:              return KB_KEY_4;
        case XK_5:              return KB_KEY_5;
        case XK_6:              return KB_KEY_6;
        case XK_7:              return KB_KEY_7;
        case XK_8:              return KB_KEY_8;
        case XK_9:              return KB_KEY_9;
        case XK_0:              return KB_KEY_0;
        case XK_space:          return KB_KEY_SPACE;
        case XK_minus:          return KB_KEY_MINUS;
        case XK_equal:          return KB_KEY_EQUAL;
        case XK_bracketleft:    return KB_KEY_LEFT_BRACKET;
        case XK_bracketright:   return KB_KEY_RIGHT_BRACKET;
        case XK_backslash:      return KB_KEY_BACKSLASH;
        case XK_semicolon:      return KB_KEY_SEMICOLON;
        case XK_apostrophe:     return KB_KEY_APOSTROPHE;
        case XK_grave:          return KB_KEY_GRAVE_ACCENT;
        case XK_comma:          return KB_KEY_COMMA;
        case XK_period:         return KB_KEY_PERIOD;
        case XK_slash:          return KB_KEY_SLASH;
        case XK_less:           return KB_KEY_WORLD_1; // At least in some layouts...
        default:                break;
    }

    return KB_KEY_UNKNOWN;
}